

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dimensions_reductions.hpp
# Opt level: O0

size_type __thiscall
std::experimental::detail::
dims_unary_reduction<std::experimental::detail::identity_by_value,std::experimental::detail::multiplies_by_value,std::experimental::detail::static_sentinel<1ul>,1ul,2ul>
::operator()(dims_unary_reduction<std::experimental::detail::identity_by_value,std::experimental::detail::multiplies_by_value,std::experimental::detail::static_sentinel<1ul>,1ul,2ul>
             *this,dimensions<18446744073709551615UL,_18446744073709551615UL> d0)

{
  dimensions<18446744073709551615UL,_18446744073709551615UL> d0_00;
  value_type v0;
  unsigned_long uVar1;
  size_type v1;
  dims_unary_reduction<std::experimental::detail::identity_by_value,std::experimental::detail::multiplies_by_value,std::experimental::detail::static_sentinel<1ul>,2ul,2ul>
  local_23;
  identity_by_value local_22;
  multiplies_by_value local_21;
  dims_unary_reduction<std::experimental::detail::identity_by_value,std::experimental::detail::multiplies_by_value,std::experimental::detail::static_sentinel<1ul>,1ul,2ul>
  *local_20;
  dims_unary_reduction<std::experimental::detail::identity_by_value,_std::experimental::detail::multiplies_by_value,_std::experimental::detail::static_sentinel<1UL>,_1UL,_2UL>
  *this_local;
  dimensions<18446744073709551615UL,_18446744073709551615UL> d0_local;
  
  d0_local.dynamic_dims_._M_elems[0] = d0.dynamic_dims_._M_elems[1];
  this_local = d0.dynamic_dims_._M_elems[0];
  local_20 = this;
  v0 = dimensions<18446744073709551615UL,_18446744073709551615UL>::operator[]<unsigned_long>
                 ((dimensions<18446744073709551615UL,_18446744073709551615UL> *)&this_local,1);
  uVar1 = identity_by_value::operator()(&local_22,v0);
  d0_00.dynamic_dims_._M_elems[1] = d0_local.dynamic_dims_._M_elems[0];
  d0_00.dynamic_dims_._M_elems[0] = (unsigned_long)this_local;
  v1 = dims_unary_reduction<std::experimental::detail::identity_by_value,std::experimental::detail::multiplies_by_value,std::experimental::detail::static_sentinel<1ul>,2ul,2ul>
       ::operator()(&local_23,d0_00);
  uVar1 = multiplies_by_value::operator()(&local_21,uVar1,v1);
  return uVar1;
}

Assistant:

constexpr typename dimensions<Dims0...>::size_type operator()(
        dimensions<Dims0...> d0
        ) const noexcept
    {
        static_assert(
            std::rank<dimensions<Dims0...> >::value == Size 
          , "Size not equal to rank of argument"
        );
        return Reduction()(
            Op()(d0[Idx])
          , dims_unary_reduction<Op, Reduction, Sentinel, Idx + 1, Size>()
                (std::move(d0))
        );
    }